

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseModuleFieldList(WastParser *this,Module *module)

{
  FuncDeclaration *pFVar1;
  ModuleFieldType MVar2;
  int iVar3;
  Errors *errors;
  pointer pTVar4;
  pointer pTVar5;
  bool bVar6;
  bool bVar7;
  TokenType TVar8;
  TokenType TVar9;
  Result RVar10;
  _Hash_node_base *p_Var11;
  _func_int **pp_Var12;
  ModuleField *field;
  ModuleField *pMVar13;
  Func *func;
  TokenTypePair pair;
  TokenTypePair pair_00;
  FuncDeclaration *decl;
  ResolveFuncTypesExprVisitorDelegate delegate;
  Delegate local_98;
  Module *local_90;
  Errors *local_88;
  ExprVisitor local_80;
  
  TVar8 = Peek(this,0);
  TVar9 = Peek(this,1);
  pair._M_elems[1] = TVar9;
  pair._M_elems[0] = TVar8;
  bVar6 = anon_unknown_1::IsModuleField(pair);
  if (bVar6) {
    do {
      RVar10 = ParseModuleField(this,module);
      if ((RVar10.enum_ == Error) &&
         (RVar10 = Synchronize(this,anon_unknown_1::IsModuleField), RVar10.enum_ == Error)) {
        return (Result)Error;
      }
      TVar8 = Peek(this,0);
      TVar9 = Peek(this,1);
      pair_00._M_elems[1] = TVar9;
      pair_00._M_elems[0] = TVar8;
      bVar6 = anon_unknown_1::IsModuleField(pair_00);
    } while (bVar6);
  }
  pMVar13 = (module->fields).first_;
  if (pMVar13 != (ModuleField *)0x0) {
    errors = this->errors_;
    bVar6 = false;
    do {
      MVar2 = pMVar13->type_;
      if (MVar2 == Event) {
        decl = (FuncDeclaration *)&pMVar13[1].loc.filename.size_;
        bVar7 = true;
LAB_0015def5:
        func = (Func *)0x0;
      }
      else {
        if (MVar2 == Import) {
          pp_Var12 = pMVar13[1]._vptr_ModuleField;
          iVar3 = *(int *)(pp_Var12 + 9);
          bVar7 = pp_Var12 != (_func_int **)0x0;
          pFVar1 = (FuncDeclaration *)(pp_Var12 + 0xe);
          if (iVar3 != 4) {
            pp_Var12 = (_func_int **)0x0;
          }
          decl = (FuncDeclaration *)(pp_Var12 + 0xe);
          if (pp_Var12 == (_func_int **)0x0) {
            decl = (FuncDeclaration *)0x0;
          }
          if (bVar7 && iVar3 == 0) {
            decl = pFVar1;
          }
          bVar7 = pp_Var12 != (_func_int **)0x0 || bVar7 && iVar3 == 0;
          goto LAB_0015def5;
        }
        if (MVar2 == Func) {
          func = (Func *)(pMVar13 + 1);
          decl = (FuncDeclaration *)&pMVar13[1].loc.filename.size_;
          bVar7 = true;
        }
        else {
          decl = (FuncDeclaration *)0x0;
          func = (Func *)0x0;
          bVar7 = false;
        }
      }
      if (bVar7) {
        if (decl == (FuncDeclaration *)0x0) {
          bVar7 = false;
        }
        else {
          bVar7 = anon_unknown_1::ResolveFuncTypeWithEmptySignature(module,decl);
          anon_unknown_1::ResolveImplicitlyDefinedFunctionType(&pMVar13->loc,module,decl);
          RVar10 = anon_unknown_1::CheckFuncTypeVarMatchesExplicit(&pMVar13->loc,module,decl,errors)
          ;
          bVar6 = RVar10.enum_ == Error || bVar6;
        }
        if (func != (Func *)0x0) {
          if ((bVar7 != false) &&
             (p_Var11 = (func->bindings).
                        super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                        ._M_h._M_before_begin._M_nxt, p_Var11 != (_Hash_node_base *)0x0)) {
            pTVar4 = (func->decl).sig.param_types.
                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            pTVar5 = (func->decl).sig.param_types.
                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                     super__Vector_impl_data._M_start;
            do {
              *(int *)&p_Var11[9]._M_nxt =
                   *(int *)&p_Var11[9]._M_nxt + (int)((ulong)((long)pTVar4 - (long)pTVar5) >> 2);
              p_Var11 = p_Var11->_M_nxt;
            } while (p_Var11 != (_Hash_node_base *)0x0);
          }
          local_98._vptr_Delegate = (_func_int **)&PTR__Delegate_001b0238;
          local_90 = module;
          local_88 = errors;
          ExprVisitor::ExprVisitor(&local_80,&local_98);
          RVar10 = ExprVisitor::VisitFunc(&local_80,func);
          if (local_80.expr_iter_stack_.
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_80.expr_iter_stack_.
                            super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_80.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_80.expr_stack_.
                            super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_80.state_stack_.
              super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_80.state_stack_.
                            super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          bVar6 = bVar6 || RVar10.enum_ == Error;
        }
      }
      pMVar13 = (pMVar13->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar13 != (ModuleField *)0x0);
    if (bVar6) {
      return (Result)Error;
    }
  }
  RVar10 = ResolveNamesModule(module,this->errors_);
  return (Result)(uint)(RVar10.enum_ == Error);
}

Assistant:

Result WastParser::ParseModuleFieldList(Module* module) {
  WABT_TRACE(ParseModuleFieldList);
  while (IsModuleField(PeekPair())) {
    if (Failed(ParseModuleField(module))) {
      CHECK_RESULT(Synchronize(IsModuleField));
    }
  }
  CHECK_RESULT(ResolveFuncTypes(module, errors_));
  CHECK_RESULT(ResolveNamesModule(module, errors_));
  return Result::Ok;
}